

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteBeginException(WatWriter *this,Exception *except)

{
  Type *pTVar1;
  string_view str;
  undefined8 uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  NextChar in_R8D;
  const_iterator __begin3;
  Type *pTVar3;
  
  WritePuts(this,"(",None);
  WritePuts(this,"except",Space);
  this->indent_ = this->indent_ + 2;
  str.data_ = (except->name)._M_dataplus._M_p;
  str.size_ = (except->name)._M_string_length;
  WriteNameOrIndex(this,str,this->except_index_,in_R8D);
  WriteInlineExports(this,Except,this->except_index_);
  WriteInlineImport(this,Except,this->except_index_);
  pTVar1 = (except->sig).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar2 = extraout_RDX;
  for (pTVar3 = (except->sig).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar1 != pTVar3; pTVar3 = pTVar3 + 1) {
    WriteType(this,*pTVar3,(NextChar)uVar2);
    uVar2 = extraout_RDX_00;
  }
  this->except_index_ = this->except_index_ + 1;
  return;
}

Assistant:

void WatWriter::WriteBeginException(const Exception& except) {
  WriteOpenSpace("except");
  WriteNameOrIndex(except.name, except_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Except, except_index_);
  WriteInlineImport(ExternalKind::Except, except_index_);
  WriteTypes(except.sig, nullptr);
  ++except_index_;
}